

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader_halfedge.h
# Opt level: O1

GLfloat * __thiscall CMU462::ObjLoaderHalfedgeMesh::getData(ObjLoaderHalfedgeMesh *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  _List_node_base *p_Var9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  GLfloat *pGVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  _List_node_base *p_Var19;
  long lVar20;
  
  this->nf = (GLint)(this->mesh->faces).
                    super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl._M_node.
                    _M_size;
  if (this->isData == true) {
    if (this->vertices != (GLfloat *)0x0) {
      operator_delete__(this->vertices);
    }
  }
  else {
    this->isData = true;
  }
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)this->nf) {
    uVar17 = (long)this->nf * 0x48;
  }
  pGVar15 = (GLfloat *)operator_new__(uVar17);
  this->vertices = pGVar15;
  p_Var19 = (this->mesh->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var19 != (_List_node_base *)&this->mesh->faces) {
    lVar20 = 0;
    lVar18 = 0;
    do {
      lVar16 = (long)p_Var19[9]._M_next[2]._M_next;
      dVar1 = *(double *)(lVar16 + 0x18);
      p_Var9 = *(_List_node_base **)((long)(p_Var19[9]._M_next + 1) + 8);
      dVar2 = *(double *)(lVar16 + 0x20);
      lVar10 = (long)p_Var9[2]._M_next;
      dVar3 = *(double *)(lVar10 + 0x10);
      dVar4 = *(double *)(lVar10 + 0x18);
      lVar11 = (long)(*(_List_node_base **)((long)(p_Var9 + 1) + 8))[2]._M_next;
      dVar5 = *(double *)(lVar10 + 0x20);
      pGVar15 = this->vertices;
      dVar6 = *(double *)(lVar11 + 0x10);
      dVar7 = *(double *)(lVar11 + 0x18);
      dVar8 = *(double *)(lVar11 + 0x20);
      pGVar15[lVar18 * 0x12] = (float)*(double *)(lVar16 + 0x10);
      pGVar15[lVar18 * 0x12 + 1] = (float)dVar1;
      pGVar15[lVar18 * 0x12 + 2] = (float)dVar2;
      pGVar15[lVar18 * 0x12 + 6] = (float)dVar3;
      pGVar15[lVar18 * 0x12 + 7] = (float)dVar4;
      pGVar15[lVar18 * 0x12 + 8] = (float)dVar5;
      pGVar15[lVar18 * 0x12 + 0xc] = (float)dVar6;
      pGVar15[lVar18 * 0x12 + 0xd] = (float)dVar7;
      pGVar15[lVar18 * 0x12 + 0xe] = (float)dVar8;
      iVar12 = rand();
      iVar13 = rand();
      iVar14 = rand();
      pGVar15 = this->vertices;
      lVar16 = 0x14;
      do {
        *(float *)((long)pGVar15 + lVar16 + lVar20 + -8) = (float)iVar12 / 2.1474836e+09;
        *(float *)((long)pGVar15 + lVar16 + lVar20 + -4) = (float)iVar13 / 2.1474836e+09;
        *(float *)((long)pGVar15 + lVar16 + lVar20) = (float)iVar14 / 2.1474836e+09;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x5c);
      lVar18 = lVar18 + 1;
      p_Var19 = p_Var19->_M_next;
      lVar20 = lVar20 + 0x48;
    } while (p_Var19 != (_List_node_base *)&this->mesh->faces);
  }
  return this->vertices;
}

Assistant:

GLfloat* getData() {
        // Generate new vertices.
        nf = mesh->nFaces();
        if (isData) {
            delete[] vertices;
        } else {
            isData = true;
        }
        vertices = new GLfloat[STRIDE * nf];

        size_t i = 0;
        for (auto f = mesh->facesBegin(); f != mesh->facesEnd(); f++, i++) {
            auto pos1 = f->halfedge()->vertex()->position;
            auto pos2 = f->halfedge()->next()->vertex()->position;
            auto pos3 = f->halfedge()->next()->next()->vertex()->position;

            vertices[STRIDE * i    ]  = pos1.x;
            vertices[STRIDE * i + 1]  = pos1.y;
            vertices[STRIDE * i + 2]  = pos1.z;

            vertices[STRIDE * i + NUM_ATTR    ]  = pos2.x;
            vertices[STRIDE * i + NUM_ATTR + 1]  = pos2.y;
            vertices[STRIDE * i + NUM_ATTR + 2]  = pos2.z;

            vertices[STRIDE * i + NUM_ATTR * 2    ] = pos3.x;
            vertices[STRIDE * i + NUM_ATTR * 2 + 1] = pos3.y;
            vertices[STRIDE * i + NUM_ATTR * 2 + 2] = pos3.z;

            GLfloat color1 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color2 = static_cast<double>(rand()) / RAND_MAX;
            GLfloat color3 = static_cast<double>(rand()) / RAND_MAX;
            for (size_t j = 0; j < 3; ++j) {
                vertices[STRIDE * i + NUM_ATTR * j + 3] = color1;
                vertices[STRIDE * i + NUM_ATTR * j + 4] = color2;
                vertices[STRIDE * i + NUM_ATTR * j + 5] = color3;
            }
        }

        return vertices;
    }